

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O1

void estimate_noise(FIRSTPASS_STATS *first_stats,FIRSTPASS_STATS *last_stats,
                   aom_internal_error_info *error_info)

{
  FIRSTPASS_STATS *pFVar1;
  FIRSTPASS_STATS *pFVar2;
  FIRSTPASS_STATS *pFVar3;
  void *memblk;
  ulong uVar4;
  double *pdVar5;
  long lVar6;
  int iVar7;
  FIRSTPASS_STATS *pFVar8;
  int iVar9;
  long lVar10;
  double *pdVar11;
  uint uVar12;
  double dVar13;
  double total_noise;
  double total_wt;
  double dVar14;
  double dVar15;
  
  pFVar1 = first_stats + 2;
  for (pFVar3 = pFVar1; pFVar3 < last_stats; pFVar3 = pFVar3 + 1) {
    pFVar3->noise_var = 0.0;
    if (((pFVar3->is_flash == 0) && (pFVar3[-1].is_flash == 0)) && (pFVar3[-2].is_flash == 0)) {
      dVar13 = (pFVar3->intra_error - pFVar3->coded_error) * pFVar3[-1].intra_error;
      if (0.0 < dVar13) {
        dVar15 = (pFVar3[-1].intra_error - pFVar3[-1].coded_error) * pFVar3[-2].intra_error;
        if ((0.0 < dVar15) &&
           (dVar14 = pFVar3[-2].intra_error * (pFVar3->intra_error - pFVar3->sr_coded_error),
           0.0 < dVar14)) {
          if (dVar13 < 0.0) {
            dVar13 = sqrt(dVar13);
          }
          else {
            dVar13 = SQRT(dVar13);
          }
          if (dVar15 < 0.0) {
            dVar15 = sqrt(dVar15);
          }
          else {
            dVar15 = SQRT(dVar15);
          }
          if (dVar14 < 0.0) {
            dVar14 = sqrt(dVar14);
          }
          else {
            dVar14 = SQRT(dVar14);
          }
          dVar13 = pFVar3[-1].intra_error - (dVar13 * dVar15) / dVar14;
          if (dVar13 <= 0.01) {
            dVar13 = 0.01;
          }
          pFVar3->noise_var = dVar13;
        }
      }
    }
  }
  pFVar3 = first_stats + 2;
  if (pFVar3 < last_stats) {
    uVar4 = 0x1d0;
    lVar6 = 0x2b8;
LAB_001f8d31:
    if (((pFVar3->is_flash == 0) && (pFVar3[-1].is_flash == 0)) &&
       ((pFVar3[-2].is_flash == 0 &&
        (pFVar8 = pFVar3, pFVar3->noise_var <= 1.0 && pFVar3->noise_var != 1.0)))) {
      do {
        pFVar2 = pFVar8;
        pFVar8 = pFVar2 + 1;
        if (last_stats <= pFVar8) {
          lVar10 = lVar6;
          if (0x2b7 < uVar4) goto LAB_001f8db0;
          goto LAB_001f8df1;
        }
      } while (((pFVar2[1].is_flash != 0) || (pFVar2->is_flash != 0)) ||
              ((pFVar2[-1].is_flash != 0 || (dVar13 = pFVar2[1].noise_var, dVar13 < 1.0))));
LAB_001f8e0c:
      pFVar3->noise_var = dVar13;
    }
    goto LAB_001f8df1;
  }
LAB_001f8e16:
  pFVar3 = first_stats + 2;
  if (pFVar3 < last_stats) {
    pdVar5 = &first_stats[3].noise_var;
    uVar4 = 0x1d0;
    lVar6 = 0x2b8;
    do {
      if (((pFVar3->is_flash != 0) || (pFVar3[-1].is_flash != 0)) || (pFVar3[-2].is_flash != 0)) {
        pFVar8 = pFVar3 + 1;
        pdVar11 = pdVar5;
        while (pFVar8 < last_stats) {
          if (((pdVar11[-1] == 0.0) && (pdVar11[-0x1e] == 0.0)) && (pdVar11[-0x3b] == 0.0))
          goto LAB_001f8ee1;
          pFVar8 = (FIRSTPASS_STATS *)(pdVar11 + 4);
          pdVar11 = pdVar11 + 0x1d;
        }
        lVar10 = lVar6;
        if (0x2b7 < uVar4) {
LAB_001f8ea4:
          if (((*(long *)((long)first_stats + lVar10 + -0x110) != 0) ||
              (*(long *)((long)first_stats + lVar10 + -0x1f8) != 0)) ||
             (*(long *)((long)first_stats + lVar10 + -0x2e0) != 0)) goto LAB_001f8ec5;
          pdVar11 = (double *)((long)first_stats + lVar10 + -0x108);
LAB_001f8ee1:
          pFVar3->noise_var = *pdVar11;
        }
      }
LAB_001f8eee:
      pFVar3 = (FIRSTPASS_STATS *)((long)&first_stats[1].frame + uVar4);
      uVar4 = uVar4 + 0xe8;
      pdVar5 = pdVar5 + 0x1d;
      lVar6 = lVar6 + 0xe8;
    } while (pFVar3 < last_stats);
  }
  if (pFVar1 < last_stats) {
    uVar4 = 0;
    do {
      *(double *)((long)&first_stats->noise_var + uVar4) = first_stats[2].noise_var;
      if (0xe7 < uVar4) break;
      uVar4 = uVar4 + 0xe8;
    } while (pFVar1 < last_stats);
  }
  uVar12 = (int)((long)last_stats - (long)first_stats >> 3) * 0x4f72c235;
  memblk = aom_malloc((long)(int)uVar12 << 3);
  if (memblk != (void *)0x0) {
    if (0 < (int)uVar12) {
      uVar4 = 0;
      do {
        dVar15 = 0.0;
        iVar7 = -3;
        dVar13 = 0.0;
        do {
          iVar9 = (int)uVar4 + iVar7;
          if (iVar9 < 1) {
            iVar9 = 0;
          }
          if ((int)(uVar12 - 1) <= iVar9) {
            iVar9 = uVar12 - 1;
          }
          if (first_stats[iVar9].is_flash == 0) {
            dVar13 = dVar13 + first_stats[iVar9].noise_var;
            dVar15 = dVar15 + 1.0;
          }
          iVar7 = iVar7 + 1;
        } while (iVar7 != 4);
        if (dVar15 <= 0.01) {
          dVar13 = first_stats[uVar4].noise_var;
        }
        else {
          dVar13 = dVar13 / dVar15;
        }
        *(double *)((long)memblk + uVar4 * 8) = dVar13;
        uVar4 = uVar4 + 1;
      } while (uVar4 != (uVar12 & 0x7fffffff));
      if (0 < (int)uVar12) {
        pdVar5 = &first_stats->noise_var;
        uVar4 = 0;
        do {
          *pdVar5 = *(double *)((long)memblk + uVar4 * 8);
          uVar4 = uVar4 + 1;
          pdVar5 = pdVar5 + 0x1d;
        } while ((uVar12 & 0x7fffffff) != uVar4);
      }
    }
    aom_free(memblk);
    if (memblk != (void *)0x0) {
      return;
    }
  }
  aom_internal_error(error_info,AOM_CODEC_MEM_ERROR,
                     "Error allocating buffers in smooth_filter_noise()");
  return;
  while (lVar10 = lVar10 + -0xe8, 0x39f < lVar10) {
LAB_001f8db0:
    if ((((*(long *)((long)first_stats + lVar10 + -0x110) == 0) &&
         (*(long *)((long)first_stats + lVar10 + -0x1f8) == 0)) &&
        (*(long *)((long)first_stats + lVar10 + -0x2e0) == 0)) &&
       (dVar13 = *(double *)((long)first_stats + lVar10 + -0x108), 1.0 <= dVar13))
    goto LAB_001f8e0c;
  }
LAB_001f8df1:
  pFVar3 = (FIRSTPASS_STATS *)((long)&first_stats[1].frame + uVar4);
  uVar4 = uVar4 + 0xe8;
  lVar6 = lVar6 + 0xe8;
  if (last_stats <= pFVar3) goto LAB_001f8e16;
  goto LAB_001f8d31;
LAB_001f8ec5:
  lVar10 = lVar10 + -0xe8;
  if (lVar10 < 0x3a0) goto LAB_001f8eee;
  goto LAB_001f8ea4;
}

Assistant:

static void estimate_noise(FIRSTPASS_STATS *first_stats,
                           FIRSTPASS_STATS *last_stats,
                           struct aom_internal_error_info *error_info) {
  FIRSTPASS_STATS *this_stats, *next_stats;
  double C1, C2, C3, noise;
  for (this_stats = first_stats + 2; this_stats < last_stats; this_stats++) {
    this_stats->noise_var = 0.0;
    // flashes tend to have high correlation of innovations, so ignore them.
    if (this_stats->is_flash || (this_stats - 1)->is_flash ||
        (this_stats - 2)->is_flash)
      continue;

    C1 = (this_stats - 1)->intra_error *
         (this_stats->intra_error - this_stats->coded_error);
    C2 = (this_stats - 2)->intra_error *
         ((this_stats - 1)->intra_error - (this_stats - 1)->coded_error);
    C3 = (this_stats - 2)->intra_error *
         (this_stats->intra_error - this_stats->sr_coded_error);
    if (C1 <= 0 || C2 <= 0 || C3 <= 0) continue;
    C1 = sqrt(C1);
    C2 = sqrt(C2);
    C3 = sqrt(C3);

    noise = (this_stats - 1)->intra_error - C1 * C2 / C3;
    noise = AOMMAX(noise, 0.01);
    this_stats->noise_var = noise;
  }

  // Copy noise from the neighbor if the noise value is not trustworthy
  for (this_stats = first_stats + 2; this_stats < last_stats; this_stats++) {
    if (this_stats->is_flash || (this_stats - 1)->is_flash ||
        (this_stats - 2)->is_flash)
      continue;
    if (this_stats->noise_var < 1.0) {
      int found = 0;
      // TODO(bohanli): consider expanding to two directions at the same time
      for (next_stats = this_stats + 1; next_stats < last_stats; next_stats++) {
        if (next_stats->is_flash || (next_stats - 1)->is_flash ||
            (next_stats - 2)->is_flash || next_stats->noise_var < 1.0)
          continue;
        found = 1;
        this_stats->noise_var = next_stats->noise_var;
        break;
      }
      if (found) continue;
      for (next_stats = this_stats - 1; next_stats >= first_stats + 2;
           next_stats--) {
        if (next_stats->is_flash || (next_stats - 1)->is_flash ||
            (next_stats - 2)->is_flash || next_stats->noise_var < 1.0)
          continue;
        this_stats->noise_var = next_stats->noise_var;
        break;
      }
    }
  }

  // copy the noise if this is a flash
  for (this_stats = first_stats + 2; this_stats < last_stats; this_stats++) {
    if (this_stats->is_flash || (this_stats - 1)->is_flash ||
        (this_stats - 2)->is_flash) {
      int found = 0;
      for (next_stats = this_stats + 1; next_stats < last_stats; next_stats++) {
        if (next_stats->is_flash || (next_stats - 1)->is_flash ||
            (next_stats - 2)->is_flash)
          continue;
        found = 1;
        this_stats->noise_var = next_stats->noise_var;
        break;
      }
      if (found) continue;
      for (next_stats = this_stats - 1; next_stats >= first_stats + 2;
           next_stats--) {
        if (next_stats->is_flash || (next_stats - 1)->is_flash ||
            (next_stats - 2)->is_flash)
          continue;
        this_stats->noise_var = next_stats->noise_var;
        break;
      }
    }
  }

  // if we are at the first 2 frames, copy the noise
  for (this_stats = first_stats;
       this_stats < first_stats + 2 && (first_stats + 2) < last_stats;
       this_stats++) {
    this_stats->noise_var = (first_stats + 2)->noise_var;
  }

  if (smooth_filter_noise(first_stats, last_stats) == -1) {
    aom_internal_error(error_info, AOM_CODEC_MEM_ERROR,
                       "Error allocating buffers in smooth_filter_noise()");
  }
}